

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::VectorRasterizerTests::SubPixelLineExpandsMargins(VectorRasterizerTests *this)

{
  bool value;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  allocator local_369;
  string local_368 [32];
  LocationInfo local_348;
  int local_31c [2];
  allocator local_311;
  string local_310 [32];
  LocationInfo local_2f0;
  int local_2c4 [2];
  allocator local_2b9;
  string local_2b8 [32];
  LocationInfo local_298;
  int local_26c [2];
  allocator local_261;
  string local_260 [32];
  LocationInfo local_240;
  allocator local_211;
  string local_210 [32];
  LocationInfo local_1f0;
  int local_1c4 [2];
  allocator local_1b9;
  string local_1b8 [32];
  LocationInfo local_198;
  int local_16c [2];
  allocator local_161;
  string local_160 [32];
  LocationInfo local_140;
  int local_114 [5];
  undefined1 local_100 [8];
  vector_rasterizer vr2;
  vector_rasterizer vr1;
  VectorRasterizerTests *this_local;
  
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)&vr2._sorted);
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_100);
  iVar1 = anon_unknown_5::fp(13.0);
  iVar2 = anon_unknown_5::fp(17.0);
  iVar3 = anon_unknown_5::fp(13.5);
  iVar4 = anon_unknown_5::fp(17.7);
  vector_rasterizer::line((vector_rasterizer *)&vr2._sorted,iVar1,iVar2,iVar3,iVar4);
  iVar1 = anon_unknown_5::fp(-23.1);
  iVar2 = anon_unknown_5::fp(-37.0);
  iVar3 = anon_unknown_5::fp(-24.0);
  iVar4 = anon_unknown_5::fp(-36.7);
  vector_rasterizer::line((vector_rasterizer *)local_100,iVar1,iVar2,iVar3,iVar4);
  local_114[1] = 1;
  local_114[0] = vector_rasterizer::width((vector_rasterizer *)&vr2._sorted);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_161);
  ut::LocationInfo::LocationInfo(&local_140,(string *)local_160,0x57);
  ut::are_equal<int,int>(local_114 + 1,local_114,&local_140);
  ut::LocationInfo::~LocationInfo(&local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  local_16c[1] = 0x11;
  local_16c[0] = vector_rasterizer::min_y((vector_rasterizer *)&vr2._sorted);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_1b9);
  ut::LocationInfo::LocationInfo(&local_198,(string *)local_1b8,0x58);
  ut::are_equal<int,int>(local_16c + 1,local_16c,&local_198);
  ut::LocationInfo::~LocationInfo(&local_198);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  local_1c4[1] = 1;
  local_1c4[0] = vector_rasterizer::height((vector_rasterizer *)&vr2._sorted);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_211);
  ut::LocationInfo::LocationInfo(&local_1f0,(string *)local_210,0x59);
  ut::are_equal<int,int>(local_1c4 + 1,local_1c4,&local_1f0);
  ut::LocationInfo::~LocationInfo(&local_1f0);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  value = vector_rasterizer::empty((vector_rasterizer *)&vr2._sorted);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_261);
  ut::LocationInfo::LocationInfo(&local_240,(string *)local_260,0x5a);
  ut::is_false(value,&local_240);
  ut::LocationInfo::~LocationInfo(&local_240);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  local_26c[1] = 1;
  local_26c[0] = vector_rasterizer::width((vector_rasterizer *)local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_2b9);
  ut::LocationInfo::LocationInfo(&local_298,(string *)local_2b8,0x5c);
  ut::are_equal<int,int>(local_26c + 1,local_26c,&local_298);
  ut::LocationInfo::~LocationInfo(&local_298);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  local_2c4[1] = 0xffffffdb;
  local_2c4[0] = vector_rasterizer::min_y((vector_rasterizer *)local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_310,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_311);
  ut::LocationInfo::LocationInfo(&local_2f0,(string *)local_310,0x5d);
  ut::are_equal<int,int>(local_2c4 + 1,local_2c4,&local_2f0);
  ut::LocationInfo::~LocationInfo(&local_2f0);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  local_31c[1] = 1;
  local_31c[0] = vector_rasterizer::height((vector_rasterizer *)local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_368,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_369);
  ut::LocationInfo::LocationInfo(&local_348,(string *)local_368,0x5e);
  ut::are_equal<int,int>(local_31c + 1,local_31c,&local_348);
  ut::LocationInfo::~LocationInfo(&local_348);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_100);
  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)&vr2._sorted);
  return;
}

Assistant:

test( SubPixelLineExpandsMargins )
			{
				// INIT
				vector_rasterizer vr1, vr2;

				// ACT
				vr1.line(fp(13.0), fp(17.0), fp(13.5), fp(17.7));
				vr2.line(fp(-23.1), fp(-37.0), fp(-24.0), fp(-36.7));

				// ACT / ASSERT
				assert_equal(1, vr1.width());
				assert_equal(17, vr1.min_y());
				assert_equal(1, vr1.height());
				assert_is_false(vr1.empty());

				assert_equal(1, vr2.width());
				assert_equal(-37, vr2.min_y());
				assert_equal(1, vr2.height());
			}